

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall Dice::rollDice(Dice *this,bool testing)

{
  int iVar1;
  DiceOptions DVar2;
  ostream *poVar3;
  double dVar4;
  int local_2c;
  int i_1;
  double probability;
  int i;
  DiceOptions value;
  int numbOfDice;
  bool testing_local;
  Dice *this_local;
  
  if (testing) {
    value._3_1_ = testing;
    _numbOfDice = this;
    std::operator<<((ostream *)&std::cout,"How many dice do you want to roll? \n");
    std::istream::operator>>((istream *)&std::cin,&i);
    for (probability._0_4_ = 0; probability._0_4_ < i; probability._0_4_ = probability._0_4_ + 1) {
      DVar2 = randomDiceOption(this);
      this->totalDiceValues[DVar2] = this->totalDiceValues[DVar2] + 1;
    }
    for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
      iVar1 = this->totalDiceValues[local_2c];
      dVar4 = (double)i;
      poVar3 = std::operator<<((ostream *)&std::cout,this->DiceNames[local_2c]);
      poVar3 = std::operator<<(poVar3," : ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->totalDiceValues[local_2c]);
      poVar3 = std::operator<<(poVar3,": Probability = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,((double)iVar1 / dVar4) * 100.0);
      poVar3 = std::operator<<(poVar3,"%");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void Dice::rollDice(bool testing) {

    if(!testing)
    {return;}

    int numbOfDice;
    cout << "How many dice do you want to roll? \n";
    cin >> numbOfDice;
    DiceOptions value;

    for(int i=0; i<numbOfDice; i++)
    {
        value = randomDiceOption();
        this->totalDiceValues[value]++ ;
    }
    double probability=0.00;
    for(int i=0; i<6; i++) {
        probability = double(this->totalDiceValues[i]) / double(numbOfDice) *100.00 ;
        cout << DiceNames[i] << " : " << this->totalDiceValues[i] << ": Probability = " << probability << "%" <<  endl;
    }
}